

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

int lgx_type_is_fit(lgx_type_t *src,lgx_type_t *dst)

{
  int iVar1;
  lgx_type_t *dst_local;
  lgx_type_t *src_local;
  
  switch(src->type) {
  case T_UNKNOWN:
    src_local._4_4_ = 1;
    break;
  default:
    iVar1 = lgx_type_cmp(src,dst);
    src_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    break;
  case T_ARRAY:
    if (dst->type == T_ARRAY) {
      src_local._4_4_ = lgx_type_is_fit(&((src->u).arr)->value,&((dst->u).arr)->value);
    }
    else {
      src_local._4_4_ = 0;
    }
    break;
  case T_MAP:
    if (dst->type == T_MAP) {
      iVar1 = lgx_type_is_fit(&((src->u).arr)->value,&((dst->u).arr)->value);
      if (iVar1 == 0) {
        src_local._4_4_ = 0;
      }
      else {
        src_local._4_4_ = lgx_type_is_fit(&((src->u).map)->value,&((dst->u).map)->value);
      }
    }
    else {
      src_local._4_4_ = 0;
    }
    break;
  case T_STRUCT:
  case T_INTERFACE:
  case T_FUNCTION:
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

int lgx_type_is_fit(lgx_type_t* src, lgx_type_t* dst) {
    switch (src->type) {
        case T_UNKNOWN:
            return 1;
        case T_ARRAY:
            if (dst->type != T_ARRAY) {
                return 0;
            }
            return lgx_type_is_fit(&src->u.arr->value, &dst->u.arr->value);
        case T_MAP:
            if (dst->type != T_MAP) {
                return 0;
            }
            if (!lgx_type_is_fit(&src->u.map->key, &dst->u.map->key)) {
                return 0;
            }
            return lgx_type_is_fit(&src->u.map->value, &dst->u.map->value);
        case T_STRUCT:
        case T_INTERFACE:
        case T_FUNCTION:
            // TODO
            return 0;
        default:
            return !lgx_type_cmp(src, dst);
    }
}